

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O3

bool pvmath::houghTransform<double>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  uint32_t uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  size_type __n;
  uint uVar15;
  pointer pPVar16;
  double __x;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 in_XMM5_Qb;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOnLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> point;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> pointOffLine;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_d8;
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_c0;
  undefined1 local_a8 [16];
  vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_> local_98;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  undefined8 uStack_50;
  undefined1 local_48 [16];
  
  uVar10 = Test_Helper::runCount();
  if (uVar10 != 0) {
    uVar15 = 0;
    do {
      iVar11 = rand();
      __x = toRadians((double)(iVar11 + -0xb4 + (iVar11 / 0x168) * -0x168));
      iVar11 = rand();
      auVar17._0_8_ = (double)(iVar11 % 99);
      auVar17._8_8_ = in_XMM5_Qb;
      auVar17 = vfmadd213sd_fma(auVar17,ZEXT816(0x3fb99999a0000000),ZEXT816(0));
      local_70 = toRadians(auVar17._0_8_ + 0.10000000149011612);
      uVar12 = rand();
      iVar11 = rand();
      auVar18._0_8_ = (double)(iVar11 % 0x1ea);
      auVar18._8_8_ = in_XMM5_Qb;
      auVar17 = vfmadd132sd_fma(auVar18,ZEXT816(0x3fb99999a0000000),ZEXT816(0x3f847ae140000000));
      local_78 = auVar17._0_8_;
      local_58 = local_78 * 0.5;
      uStack_50 = 0;
      uVar13 = rand();
      __n = (size_type)(uVar13 % 100);
      if (uVar13 % 100 < 0x33) {
        __n = 0x32;
      }
      std::vector<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>::vector
                (&local_c0,__n,(allocator_type *)&local_d8);
      local_60 = sin(__x);
      local_68 = cos(__x);
      if (local_c0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_c0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        auVar8._8_8_ = uStack_50;
        auVar8._0_8_ = local_58;
        local_48._0_8_ = local_58 / 10.0;
        local_48._8_8_ = uStack_50;
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        local_a8 = vxorpd_avx512vl(auVar8,auVar7);
        uVar4 = vcmppd_avx512vl(auVar8,ZEXT816(0) << 0x40,1);
        uVar5 = vcmppd_avx512vl(local_48,ZEXT816(0) << 0x40,1);
        iVar11 = (int)((local_58 + local_58) / (double)local_48._0_8_);
        pPVar16 = local_c0.
                  super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (iVar11 < 2) {
          iVar11 = 1;
        }
        do {
          iVar14 = rand();
          auVar22._0_8_ = (double)(iVar14 % 200000);
          auVar22._8_8_ = in_XMM5_Qb;
          auVar17 = vfmadd132sd_fma(auVar22,ZEXT816(0xc08f400000000000),ZEXT816(0x3f847ae140000000))
          ;
          if ((((ushort)uVar4 & 3 | (ushort)uVar5 & 3) & 1) == 0) {
            iVar14 = rand();
            auVar19._0_8_ = (double)(iVar14 % iVar11);
            auVar19._8_8_ = in_XMM5_Qb;
            auVar1._8_8_ = 0;
            auVar1._0_8_ = local_48._0_8_;
            auVar18 = vfmadd132sd_fma(auVar19,local_a8,auVar1);
            dVar3 = auVar18._0_8_ + auVar17._0_8_;
            iVar14 = rand();
            auVar20._0_8_ = (double)(iVar14 % iVar11);
            auVar20._8_8_ = in_XMM5_Qb;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_48._0_8_;
            auVar17 = vfmadd132sd_fma(auVar20,local_a8,auVar2);
            dVar6 = auVar17._0_8_;
          }
          else {
            dVar3 = auVar17._0_8_ - local_58;
            dVar6 = (double)local_a8._0_8_;
          }
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_60;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_68;
          auVar23._8_8_ = 0;
          auVar23._0_8_ = local_60 * dVar6;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = dVar3;
          auVar18 = vfmsub231sd_fma(auVar23,auVar26,auVar25);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = local_68 * dVar6;
          auVar17 = vfmadd231sd_fma(auVar21,auVar24,auVar26);
          pPVar16->x = auVar18._0_8_;
          pPVar16->y = auVar17._0_8_;
          pPVar16 = pPVar16 + 1;
        } while (pPVar16 !=
                 local_c0.
                 super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar9 = Image_Function::HoughTransform
                        (&local_c0,__x,local_70,
                         local_70 / (double)(uVar12 % 0x32 + (uint)(uVar12 % 0x32 == 0)),local_78,
                         &local_d8,&local_98);
      if (!bVar9 || local_98.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start !=
                    local_98.
                    super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
        if (local_98.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_98.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_c0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c0.
                          super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        return false;
      }
      if (local_98.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_98.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_d8.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d8.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_c0.super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.
                        super__Vector_base<PointBase2D<double>,_std::allocator<PointBase2D<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar15 = uVar15 + 1;
      uVar10 = Test_Helper::runCount();
    } while (uVar15 < uVar10);
  }
  return true;
}

Assistant:

bool houghTransform()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const _Type angle = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>(-180, 180, 1 ) ) );
            const _Type angleTolerance = static_cast<_Type>( toRadians( Unit_Test::randomFloatValue<_Type>( 0, 10, 0.1f ) + 0.1f ) );
            const _Type angleStep = angleTolerance / Unit_Test::randomValue( 1, 50 );
            const _Type lineTolerance = Unit_Test::randomFloatValue<_Type>( 0.1f, 5, 0.01f );

            const _Type noiseValue = lineTolerance / 2;
            std::vector< PointBase2D<_Type> > point( Unit_Test::randomValue<uint32_t>( 50u, 100u ) );

            const _Type sinVal = std::sin( angle );
            const _Type cosVal = std::cos( angle );

            for ( typename std::vector< PointBase2D<_Type> >::iterator p = point.begin(); p != point.end(); ++p ) {
                const _Type x = Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) + Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );
                const _Type y = Unit_Test::randomFloatValue<_Type>( -noiseValue, noiseValue, noiseValue / 10 );

                p->x = x * cosVal - y * sinVal;
                p->y = x * sinVal + y * cosVal;
            }

            std::vector< PointBase2D<_Type> > pointOnLine;
            std::vector< PointBase2D<_Type> > pointOffLine;

            if ( !Image_Function::HoughTransform( point, angle, angleTolerance, angleStep, lineTolerance, pointOnLine, pointOffLine ) ||
                 !pointOffLine.empty() )
                return false;
        }

        return true;
    }